

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O2

void __thiscall fmcalc::init_fmxref(fmcalc *this)

{
  int iVar1;
  bool bVar2;
  FILE *__stream;
  size_t sVar3;
  mapped_type *pmVar4;
  fmcalc *this_00;
  string file;
  undefined1 local_70 [32];
  fmXref f;
  
  this_00 = (fmcalc *)&file;
  std::__cxx11::string::string((string *)this_00,"input/fm_xref_a0.bin",(allocator *)&f);
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)&file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                   &this->inputpath_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    std::__cxx11::string::operator=((string *)&file,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    this_00 = (fmcalc *)local_70;
    std::__cxx11::string::~string((string *)this_00);
  }
  if (this->allocrule_ == 0) {
    bVar2 = fileexists(this_00,&file);
    if (bVar2) goto LAB_001046f2;
  }
  std::__cxx11::string::assign((char *)&file);
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)&file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                   &this->inputpath_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    std::__cxx11::string::operator=((string *)&file,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    std::__cxx11::string::~string((string *)local_70);
  }
LAB_001046f2:
  __stream = fopen(file._M_dataplus._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    sVar3 = fread(&f,0xc,1,__stream);
    while (iVar1 = f.output_id, sVar3 != 0) {
      local_70._0_4_ = f.agg_id;
      local_70._4_4_ = f.layer_id;
      pmVar4 = std::
               map<fmxref_key,_int,_std::less<fmxref_key>,_std::allocator<std::pair<const_fmxref_key,_int>_>_>
               ::operator[](&fm_xrefmap,(key_type *)local_70);
      *pmVar4 = iVar1;
      sVar3 = fread(&f,0xc,1,__stream);
    }
    fclose(__stream);
    std::__cxx11::string::~string((string *)&file);
    return;
  }
  fprintf(_stderr,"FATAL: %s: cannot open %s\n","init_fmxref",file._M_dataplus._M_p);
  exit(1);
}

Assistant:

void fmcalc::init_fmxref()
{
	FILE *fin = NULL;
	std::string file = FMXREF_FILE_A0;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	if (allocrule_ == 0  && fileexists(file) ) {		
		fin = fopen(file.c_str(), "rb");
	}
	else {
		file = FMXREF_FILE;
		if (inputpath_.length() > 0) {
			file = inputpath_ + file.substr(5);
		}
		fin = fopen(file.c_str(), "rb");
	}
	
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}

	fmXref f;
	size_t i = fread(&f, sizeof(f), 1, fin);
	while (i != 0) {
		fmxref_key k;
		k.agg_id = f.agg_id;
		k.layer_id = f.layer_id;
/*
		if (k.agg_id == f.output_id && k.layer_id == 1) {
			// skip it
		}else {
			fm_xrefmap[k] = f.output_id;
		}
*/
		fm_xrefmap[k] = f.output_id;
		i = fread(&f, sizeof(f),  1, fin);
	}
	fclose(fin);	
}